

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O2

void qt_rectfill_quint24(QRasterBuffer *rasterBuffer,int x,int y,int width,int height,QRgba64 *color
                        )

{
  Format FVar1;
  long lVar2;
  ulong uVar3;
  quint24 color_00;
  int iVar4;
  long count;
  quint24 *dest;
  long in_FS_OFFSET;
  bool bVar5;
  quint32 c32;
  quint24 c24;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  FVar1 = rasterBuffer->format;
  c32 = QRgba64::toArgb32(color);
  c24.data[0] = 0xaa;
  c24.data[1] = 0xaa;
  c24.data[2] = 0xaa;
  (*qPixelLayouts[FVar1].storeFromARGB32PM)
            (c24.data,&c32,0,1,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
  color_00 = c24;
  uVar3 = rasterBuffer->bytes_per_line;
  dest = (quint24 *)(rasterBuffer->m_buffer + (long)y * uVar3 + (long)x * 3);
  count = (long)width;
  if ((uVar3 & 0xffffffff) == count * 3) {
    qt_memfill24(dest,c24,height * count);
  }
  else {
    iVar4 = 0;
    if (0 < height) {
      iVar4 = height;
    }
    while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
      qt_memfill24(dest,color_00,count);
      dest = (quint24 *)((long)dest->data + uVar3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void qt_rectfill_quint24(QRasterBuffer *rasterBuffer,
                                int x, int y, int width, int height,
                                const QRgba64 &color)
{
    const QPixelLayout &layout = qPixelLayouts[rasterBuffer->format];
    quint32 c32 = color.toArgb32();
    quint24 c24;
    layout.storeFromARGB32PM(reinterpret_cast<uchar *>(&c24), &c32, 0, 1, nullptr, nullptr);
    qt_rectfill<quint24>(reinterpret_cast<quint24 *>(rasterBuffer->buffer()),
                         c24, x, y, width, height, rasterBuffer->bytesPerLine());
}